

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void rewrite_file(char *filename,char *data)

{
  FILE *__stream;
  FILE *file_handler;
  char *data_local;
  char *filename_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("Could not open file %s to write results\n",filename);
  }
  else {
    fputs(data,__stream);
    fclose(__stream);
  }
  return;
}

Assistant:

void rewrite_file (char const * filename,
                   char const * data) {

  FILE * file_handler = fopen (filename, "w");
  if (!file_handler) {
    printf ("Could not open file %s to write results\n", filename);
    return;
  }
  fputs (data, file_handler);
  fclose (file_handler);
  return;
}